

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_tls.c
# Opt level: O3

void mbedtls_ssl_dtls_replay_update(mbedtls_ssl_context *ssl)

{
  uchar *puVar1;
  uint64_t shift;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  
  if ((ssl->conf->field_0x175 & 0x10) != 0) {
    puVar1 = ssl->in_ctr;
    uVar3 = (ulong)puVar1[7] |
            (ulong)puVar1[6] << 8 |
            (ulong)puVar1[5] << 0x10 |
            (ulong)puVar1[4] << 0x18 | (ulong)puVar1[3] << 0x20 | (ulong)puVar1[2] << 0x28;
    uVar4 = ssl->in_window_top;
    uVar2 = uVar3 - uVar4;
    if (uVar4 <= uVar3 && uVar2 != 0) {
      uVar4 = 1;
      if (uVar2 < 0x40) {
        uVar4 = ssl->in_window << ((byte)uVar2 & 0x3f) | 1;
      }
      ssl->in_window = uVar4;
      ssl->in_window_top = uVar3;
      return;
    }
    if (uVar4 - uVar3 < 0x40) {
      ssl->in_window = ssl->in_window | 1L << ((byte)(uVar4 - uVar3) & 0x3f);
      return;
    }
  }
  return;
}

Assistant:

void mbedtls_ssl_dtls_replay_update( mbedtls_ssl_context *ssl )
{
    uint64_t rec_seqnum = ssl_load_six_bytes( ssl->in_ctr + 2 );

    if( ssl->conf->anti_replay == MBEDTLS_SSL_ANTI_REPLAY_DISABLED )
        return;

    if( rec_seqnum > ssl->in_window_top )
    {
        /* Update window_top and the contents of the window */
        uint64_t shift = rec_seqnum - ssl->in_window_top;

        if( shift >= 64 )
            ssl->in_window = 1;
        else
        {
            ssl->in_window <<= shift;
            ssl->in_window |= 1;
        }

        ssl->in_window_top = rec_seqnum;
    }
    else
    {
        /* Mark that number as seen in the current window */
        uint64_t bit = ssl->in_window_top - rec_seqnum;

        if( bit < 64 ) /* Always true, but be extra sure */
            ssl->in_window |= (uint64_t) 1 << bit;
    }
}